

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O1

void vkt::api::anon_unknown_0::addBlittingImageAllFormatsColorSrcFormatDstFormatTests
               (TestCaseGroup *group,BlitColorTestParams *testParams)

{
  size_type *psVar1;
  pointer pCVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  BlittingTestCase *pBVar6;
  pointer pCVar7;
  ulong *puVar8;
  VkImageLayout extraout_EDX;
  VkImageLayout extraout_EDX_00;
  VkImageLayout layout;
  undefined8 in_RDX;
  undefined8 *extraout_RDX;
  undefined8 *puVar9;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 uVar10;
  char *pcVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_t sVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string description;
  string testName;
  string local_1b8;
  string local_198;
  string local_178;
  long *local_158;
  long local_150;
  long local_148;
  undefined8 uStack_140;
  string local_138;
  TestNode *local_118;
  TestContext *local_110;
  string local_108;
  long local_e8;
  long local_e0;
  Data local_d8;
  VkDeviceSize VStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  pointer local_a8;
  pointer pCStack_a0;
  long local_98;
  anon_union_4_2_42ec4cd4_for_TestParams_4 local_90;
  Data local_88;
  VkDeviceSize VStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  pointer local_58;
  pointer pCStack_50;
  long local_48;
  anon_union_4_2_42ec4cd4_for_TestParams_4 local_40;
  
  local_110 = (group->super_TestNode).m_testCtx;
  lVar3 = 0;
  local_118 = &group->super_TestNode;
  do {
    (testParams->params).src.image.operationLayout = (&DAT_00b04d30)[lVar3];
    local_e0 = 0;
    local_e8 = lVar3;
    do {
      paVar14 = &local_178.field_2;
      paVar12 = &local_198.field_2;
      (testParams->params).dst.image.operationLayout =
           *(VkImageLayout *)((long)&DAT_00b04d38 + local_e0);
      (testParams->params).field_3.filter = VK_FILTER_NEAREST;
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_1b8,
                 (_anonymous_namespace_ *)(ulong)(testParams->params).src.image.operationLayout,
                 (VkImageLayout)in_RDX);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b8);
      puVar8 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_198.field_2._M_allocated_capacity = *puVar8;
        local_198.field_2._8_8_ = plVar4[3];
        local_198._M_dataplus._M_p = (pointer)paVar12;
      }
      else {
        local_198.field_2._M_allocated_capacity = *puVar8;
        local_198._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_198._M_string_length = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_178,
                 (_anonymous_namespace_ *)(ulong)(testParams->params).dst.image.operationLayout,
                 (VkImageLayout)local_198._M_string_length);
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar12) {
        uVar10 = local_198.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_178._M_string_length + local_198._M_string_length) {
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != paVar14) {
          uVar10 = local_178.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_178._M_string_length + local_198._M_string_length)
        goto LAB_0047de8d;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_178,0,(char *)0x0,(ulong)local_198._M_dataplus._M_p);
      }
      else {
LAB_0047de8d:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_198,(ulong)local_178._M_dataplus._M_p);
      }
      local_158 = &local_148;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_148 = *plVar4;
        uStack_140 = puVar5[3];
      }
      else {
        local_148 = *plVar4;
        local_158 = (long *)*puVar5;
      }
      puVar9 = puVar5 + 1;
      local_150 = puVar5[1];
      *puVar5 = plVar4;
      *puVar9 = 0;
      *(undefined1 *)plVar4 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != paVar14) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        puVar9 = extraout_RDX;
      }
      layout = (VkImageLayout)puVar9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar12) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        layout = extraout_EDX;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        layout = extraout_EDX_00;
      }
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_108,
                 (_anonymous_namespace_ *)(ulong)(testParams->params).src.image.operationLayout,
                 layout);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,0xb05a6e);
      puVar8 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_178.field_2._M_allocated_capacity = *puVar8;
        local_178.field_2._8_8_ = plVar4[3];
        local_178._M_dataplus._M_p = (pointer)paVar14;
      }
      else {
        local_178.field_2._M_allocated_capacity = *puVar8;
        local_178._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_178._M_string_length = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_178);
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_1b8.field_2._M_allocated_capacity = *puVar8;
        local_1b8.field_2._8_8_ = plVar4[3];
      }
      else {
        local_1b8.field_2._M_allocated_capacity = *puVar8;
        local_1b8._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_1b8._M_string_length = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_138,
                 (_anonymous_namespace_ *)(ulong)(testParams->params).dst.image.operationLayout,
                 (VkImageLayout)local_1b8._M_string_length);
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        uVar10 = local_1b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_138._M_string_length + local_1b8._M_string_length) {
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          uVar10 = local_138.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_138._M_string_length + local_1b8._M_string_length)
        goto LAB_0047e05a;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_138,0,(char *)0x0,(ulong)local_1b8._M_dataplus._M_p);
      }
      else {
LAB_0047e05a:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_1b8,(ulong)local_138._M_dataplus._M_p);
      }
      psVar1 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_198.field_2._M_allocated_capacity = *psVar1;
        local_198.field_2._8_8_ = puVar5[3];
        local_198._M_dataplus._M_p = (pointer)paVar12;
      }
      else {
        local_198.field_2._M_allocated_capacity = *psVar1;
        local_198._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_198._M_string_length = puVar5[1];
      *puVar5 = psVar1;
      puVar5[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != paVar14) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      pBVar6 = (BlittingTestCase *)operator_new(0xc0);
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,local_158,(undefined1 *)(local_150 + (long)local_158));
      pcVar11 = "_nearest";
      std::__cxx11::string::append((char *)&local_1b8);
      local_88.buffer.size = (Buffer)(testParams->params).src.buffer.size;
      local_88._8_8_ = *(undefined8 *)((long)&(testParams->params).src + 8);
      local_88._16_8_ = *(undefined8 *)((long)&(testParams->params).src + 0x10);
      VStack_70 = (testParams->params).dst.buffer.size;
      local_68 = *(undefined8 *)((long)&(testParams->params).dst + 8);
      uStack_60 = *(undefined8 *)((long)&(testParams->params).dst + 0x10);
      uVar13 = (long)(testParams->params).regions.
                     super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(testParams->params).regions.
                     super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      local_58 = (pointer)0x0;
      pCStack_50 = (pointer)0x0;
      local_48 = 0;
      pCVar7 = std::
               _Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
               ::_M_allocate((_Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                              *)(((long)uVar13 >> 4) * -0x3333333333333333),(size_t)pcVar11);
      local_48 = (long)pCVar7 + uVar13;
      pCVar2 = (testParams->params).regions.
               super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar15 = (long)(testParams->params).regions.
                     super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2;
      local_58 = pCVar7;
      if (sVar15 != 0) {
        pCStack_50 = pCVar7;
        memmove(pCVar7,pCVar2,sVar15);
      }
      pCStack_50 = (pointer)(sVar15 + (long)pCVar7);
      local_40 = (testParams->params).field_3;
      BlittingTestCase::BlittingTestCase
                (pBVar6,local_110,&local_1b8,&local_198,(TestParams *)&local_88.buffer);
      tcu::TestNode::addChild(local_118,(TestNode *)pBVar6);
      in_RDX = extraout_RDX_00;
      if (pCVar7 != (pointer)0x0) {
        operator_delete(pCVar7,uVar13);
        in_RDX = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        in_RDX = extraout_RDX_02;
      }
      if (testParams->onlyNearest == false) {
        (testParams->params).field_3.filter = VK_FILTER_LINEAR;
        pBVar6 = (BlittingTestCase *)operator_new(0xc0);
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,local_158,(undefined1 *)(local_150 + (long)local_158));
        pcVar11 = "_linear";
        std::__cxx11::string::append((char *)&local_1b8);
        local_d8.buffer.size = (Buffer)(testParams->params).src.buffer.size;
        local_d8._8_8_ = *(undefined8 *)((long)&(testParams->params).src + 8);
        local_d8._16_8_ = *(undefined8 *)((long)&(testParams->params).src + 0x10);
        VStack_c0 = (testParams->params).dst.buffer.size;
        local_b8 = *(undefined8 *)((long)&(testParams->params).dst + 8);
        uStack_b0 = *(undefined8 *)((long)&(testParams->params).dst + 0x10);
        uVar13 = (long)(testParams->params).regions.
                       super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(testParams->params).regions.
                       super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        local_a8 = (pointer)0x0;
        pCStack_a0 = (pointer)0x0;
        local_98 = 0;
        pCVar7 = std::
                 _Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                 ::_M_allocate((_Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                                *)(((long)uVar13 >> 4) * -0x3333333333333333),(size_t)pcVar11);
        local_98 = (long)pCVar7 + uVar13;
        pCVar2 = (testParams->params).regions.
                 super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar15 = (long)(testParams->params).regions.
                       super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2;
        local_a8 = pCVar7;
        if (sVar15 != 0) {
          pCStack_a0 = pCVar7;
          memmove(pCVar7,pCVar2,sVar15);
        }
        pCStack_a0 = (pointer)(sVar15 + (long)pCVar7);
        local_90 = (testParams->params).field_3;
        BlittingTestCase::BlittingTestCase
                  (pBVar6,local_110,&local_1b8,&local_198,(TestParams *)&local_d8.buffer);
        tcu::TestNode::addChild(local_118,(TestNode *)pBVar6);
        in_RDX = extraout_RDX_03;
        if (pCVar7 != (pointer)0x0) {
          operator_delete(pCVar7,uVar13);
          in_RDX = extraout_RDX_04;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          in_RDX = extraout_RDX_05;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        in_RDX = extraout_RDX_06;
      }
      if (local_158 != &local_148) {
        operator_delete(local_158,local_148 + 1);
        in_RDX = extraout_RDX_07;
      }
      local_e0 = local_e0 + 4;
    } while (local_e0 == 4);
    lVar3 = local_e8 + 1;
    if (local_e8 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void addBlittingImageAllFormatsColorSrcFormatDstFormatTests (tcu::TestCaseGroup* group, BlitColorTestParams testParams)
{
	tcu::TestContext& testCtx				= group->getTestContext();

	const VkImageLayout blitSrcLayouts[]	=
	{
		VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
		VK_IMAGE_LAYOUT_GENERAL
	};
	const VkImageLayout blitDstLayouts[]	=
	{
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
		VK_IMAGE_LAYOUT_GENERAL
	};

	for (int srcLayoutNdx = 0u; srcLayoutNdx < DE_LENGTH_OF_ARRAY(blitSrcLayouts); ++srcLayoutNdx)
	{
		testParams.params.src.image.operationLayout = blitSrcLayouts[srcLayoutNdx];
		for (int dstLayoutNdx = 0u; dstLayoutNdx < DE_LENGTH_OF_ARRAY(blitDstLayouts); ++dstLayoutNdx)
		{
			testParams.params.dst.image.operationLayout = blitDstLayouts[dstLayoutNdx];

			testParams.params.filter			= VK_FILTER_NEAREST;
			const std::string testName			= getImageLayoutCaseName(testParams.params.src.image.operationLayout) + "_" +
												  getImageLayoutCaseName(testParams.params.dst.image.operationLayout);
			const std::string description		= "Blit from layout " + getImageLayoutCaseName(testParams.params.src.image.operationLayout) +
												  " to " + getImageLayoutCaseName(testParams.params.dst.image.operationLayout);
			group->addChild(new BlittingTestCase(testCtx, testName + "_nearest", description, testParams.params));

			if (!testParams.onlyNearest)
			{
				testParams.params.filter		= VK_FILTER_LINEAR;
				group->addChild(new BlittingTestCase(testCtx, testName + "_linear", description, testParams.params));
			}
		}
	}
}